

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::getProgramInterface
          (GLSLConstantIntegralExpressionTest *this,GLuint param_1,
          ProgramInterface *program_interface,VaryingPassthrough *param_3)

{
  RenderContext *pRVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  uint uVar7;
  GLint max_transform_feedback_interleaved_components;
  GLint max_transform_feedback_buffers;
  string globals;
  size_t position;
  GLchar buffer [16];
  uint local_78;
  uint local_74;
  string local_70;
  size_t local_50;
  GLchar local_48 [24];
  long lVar6;
  
  pRVar1 = ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx;
  iVar4 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,param_1));
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_74 = 0;
  local_78 = 0;
  (**(code **)(lVar6 + 0x868))(0x8e70);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2085);
  (**(code **)(lVar6 + 0x868))(0x8c8a,&local_78);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2087);
  uVar7 = local_74 + 0xf;
  if (-1 < (int)local_74) {
    uVar7 = local_74;
  }
  uVar2 = (int)uVar7 >> 4;
  if ((int)uVar7 >> 4 < 2) {
    uVar2 = 1;
  }
  uVar7 = local_78 + 0xf;
  if (-1 < (int)local_78) {
    uVar7 = local_78;
  }
  uVar3 = (int)uVar7 >> 4;
  if ((int)uVar7 >> 4 < 2) {
    uVar3 = 1;
  }
  this->m_gohan_length = local_74 / uVar2;
  this->m_goten_length = local_78 / uVar3;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "uniform uint goku [GL_ARB_enhanced_layouts / 1];\nuniform uint gohan[gl_MaxTransformFeedbackBuffers / GOHAN_DIV];\nuniform uint goten[gl_MaxTransformFeedbackInterleavedComponents / GOTEN_DIV];\n"
             ,"");
  local_50 = 0;
  sprintf(local_48,"%d",(ulong)uVar2);
  Utils::replaceToken("GOHAN_DIV",&local_50,local_48,&local_70);
  sprintf(local_48,"%d",(ulong)uVar3);
  Utils::replaceToken("GOTEN_DIV",&local_50,local_48,&local_70);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_vertex);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_tess_ctrl);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_tess_eval);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_geometry);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_fragment);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_compute);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GLSLConstantIntegralExpressionTest::getProgramInterface(GLuint /* test_case_index */,
															 Utils::ProgramInterface& program_interface,
															 Utils::VaryingPassthrough& /* varying_passthrough */)
{
	/* Get constants */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint max_transform_feedback_buffers				= 0;
	GLint max_transform_feedback_interleaved_components = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &max_transform_feedback_interleaved_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	GLuint gohan_div = std::max(1, max_transform_feedback_buffers / 16);
	GLuint goten_div = std::max(1, max_transform_feedback_interleaved_components / 16);

	m_gohan_length = max_transform_feedback_buffers / gohan_div;
	m_goten_length = max_transform_feedback_interleaved_components / goten_div;

	/* Globals */
	std::string globals = "uniform uint goku [GL_ARB_enhanced_layouts / 1];\n"
						  "uniform uint gohan[gl_MaxTransformFeedbackBuffers / GOHAN_DIV];\n"
						  "uniform uint goten[gl_MaxTransformFeedbackInterleavedComponents / GOTEN_DIV];\n";

	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", gohan_div);
	Utils::replaceToken("GOHAN_DIV", position, buffer, globals);

	sprintf(buffer, "%d", goten_div);
	Utils::replaceToken("GOTEN_DIV", position, buffer, globals);

	program_interface.m_vertex.m_globals	= globals;
	program_interface.m_tess_ctrl.m_globals = globals;
	program_interface.m_tess_eval.m_globals = globals;
	program_interface.m_geometry.m_globals  = globals;
	program_interface.m_fragment.m_globals  = globals;
	program_interface.m_compute.m_globals   = globals;
}